

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::setByteCopy(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  undefined8 in_RCX;
  undefined1 in_DL;
  undefined4 in_ESI;
  Cache *in_RDI;
  uint32_t *in_stack_00000010;
  uint32_t offset_1;
  uint32_t offset;
  int block_id;
  uint32_t *in_stack_00000090;
  uint32_t in_stack_0000009c;
  Cache *in_stack_000000a0;
  uint32_t in_stack_ffffffffffffffcc;
  value_type vVar5;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar6;
  
  uVar6 = CONCAT13(in_DL,in_stack_fffffffffffffff0);
  uVar1 = getBlockId((Cache *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (uint32_t)((ulong)in_RDI >> 0x20));
  if (uVar1 == 0xffffffff) {
    if ((in_RDI->write_allocate & 1U) == 0) {
      if (in_RDI->lower_cache == (Cache *)0x0) {
        MemoryManager::setByteNoCache
                  ((MemoryManager *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc,(uint8_t)((uint)in_stack_ffffffffffffffd8 >> 0x18));
      }
      else {
        setByteCopy((Cache *)CONCAT44(in_ESI,uVar6),(uint32_t)((ulong)in_RCX >> 0x20),
                    (uint8_t)((ulong)in_RCX >> 0x18),
                    (uint32_t *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0));
      }
    }
    else {
      loadBlockFromLowerLevel(in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
      vVar5 = (value_type)((uint)uVar6 >> 0x18);
      uVar1 = getBlockId((Cache *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (uint32_t)((ulong)in_RDI >> 0x20));
      if (uVar1 == 0xffffffff) {
        fprintf(_stderr,"Error: data should in top level cache, but it seems not\n");
        exit(-1);
      }
      uVar2 = getOffset(in_RDI,in_stack_ffffffffffffffcc);
      pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         (&in_RDI->blocks,(long)(int)uVar1);
      pvVar3->dirty = true;
      pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         (&in_RDI->blocks,(long)(int)uVar1);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pvVar3->data,(ulong)uVar2);
      *pvVar4 = vVar5;
    }
  }
  else {
    uVar2 = getOffset(in_RDI,in_stack_ffffffffffffffcc);
    vVar5 = (value_type)((uint)uVar6 >> 0x18);
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       (&in_RDI->blocks,(long)(int)uVar1);
    pvVar3->dirty = true;
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       (&in_RDI->blocks,(long)(int)uVar1);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvVar3->data,(ulong)uVar2);
    *pvVar4 = vVar5;
    if ((in_RDI->write_back & 1U) == 0) {
      std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                (&in_RDI->blocks,(long)(int)uVar1);
      writeBlockToLowerLevel((Cache *)cycles,_offset,in_stack_00000010);
    }
  }
  return;
}

Assistant:

void Cache::setByteCopy(uint32_t addr, uint8_t val, uint32_t *cycles) {
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        //in cache
        uint32_t offset = this->getOffset(addr);
        this->blocks[block_id].dirty = true;
        this->blocks[block_id].data[offset] = val;
        if (!this->write_back) {
            this->writeBlockToLowerLevel(this->blocks[block_id], cycles);
        }
        return;
    }

    if (!this->write_allocate) {
        if (this->lower_cache == nullptr) {
            this->memory->setByteNoCache(addr, val);
        } else {
            this->lower_cache->setByteCopy(addr, val, cycles);
        }
    } else {
        this->loadBlockFromLowerLevel(addr, cycles);
        if ((block_id = this->getBlockId(addr)) != -1) {
            uint32_t offset = this->getOffset(addr);
            this->blocks[block_id].dirty = true;
            this->blocks[block_id].data[offset] = val;
            return;
        } else {
            fprintf(stderr, "Error: data should in top level cache, but it seems not\n");
            exit(-1);
        }
    }
}